

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O3

void __thiscall CVmImageWriter::begin_mhls_block(CVmImageWriter *this)

{
  CVmFile *pCVar1;
  uint in_EAX;
  long lVar2;
  char b [4];
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  begin_block(this,"MHLS",0);
  pCVar1 = this->fp_;
  lVar2 = ftell((FILE *)pCVar1->fp_);
  this->mhls_cnt_pos_ = lVar2 - pCVar1->seek_base_;
  uStack_18 = (ulong)(uint)uStack_18;
  CVmFile::write_bytes(this->fp_,(char *)((long)&uStack_18 + 4),4);
  this->mhls_cnt_ = 0;
  return;
}

Assistant:

void CVmImageWriter::begin_mhls_block()
{
    /* 
     *   begin the block - MHLS blocks are always optional, since they're
     *   purely for debugging purposes 
     */
    begin_block("MHLS", FALSE);

    /* remember where the count goes so we can fix it up later */
    mhls_cnt_pos_ = fp_->get_pos();

    /* write a placehodler count */
    fp_->write_uint4(0);

    /* there are no entries yet */
    mhls_cnt_ = 0;
}